

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O1

int Am_Center_Y_Is_Center_Of_Owner_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object center_y_obj;
  Am_Object AStack_28;
  
  iVar3 = 0;
  pAVar4 = Am_Object::Get(self,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::Get_Object(&AStack_28,(Am_Slot_Key)self,10);
  bVar1 = Am_Object::Valid(&AStack_28);
  if (bVar1) {
    pAVar4 = Am_Object::Get(&AStack_28,0x67,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    iVar3 = (iVar3 - iVar2) / 2;
  }
  Am_Object::~Am_Object(&AStack_28);
  return iVar3;
}

Assistant:

Am_Define_Formula(int, Am_Center_Y_Is_Center_Of_Owner)
{
  int my_height = self.Get(Am_HEIGHT);
  Am_Object center_y_obj = self.Get_Owner();
  if (center_y_obj.Valid()) {
    int center_y_obj_height = center_y_obj.Get(Am_HEIGHT);
    return (center_y_obj_height - my_height) / 2;
  } else {
    return 0;
  }
}